

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlAttrHashInsert(xmlParserCtxtPtr ctxt,uint size,xmlChar *name,xmlChar *uri,uint hashValue,
                     int aindex)

{
  int iVar1;
  xmlChar *pxVar2;
  bool bVar3;
  int in_EAX;
  xmlAttrHashBucket *pxVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar6 = (ulong)(size - 1 & hashValue);
  pxVar4 = ctxt->attrHash + uVar6;
  do {
    lVar7 = (long)pxVar4->index;
    if (lVar7 < 0) {
      pxVar4->index = aindex;
      return 0x7fffffff;
    }
    if (ctxt->atts[lVar7] == name) {
      iVar1 = *(int *)(ctxt->atts + lVar7 + 2);
      if (iVar1 == 0x7ffffffe) {
        pxVar2 = ctxt->str_xml_ns;
joined_r0x00141879:
        bVar3 = true;
        if (pxVar2 == uri) {
LAB_00141845:
          bVar3 = false;
          in_EAX = pxVar4->index;
        }
      }
      else {
        if (iVar1 != 0x7fffffff) {
          pxVar2 = ctxt->nsTab[iVar1 * 2 + 1];
          goto joined_r0x00141879;
        }
        bVar3 = true;
        if (uri == (xmlChar *)0x0) goto LAB_00141845;
      }
      if (bVar3) goto LAB_0014184f;
      bVar3 = false;
    }
    else {
LAB_0014184f:
      uVar5 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar5;
      pxVar4 = pxVar4 + 1;
      if (size <= uVar5) {
        uVar6 = 0;
        pxVar4 = ctxt->attrHash;
      }
      bVar3 = true;
    }
    if (!bVar3) {
      return in_EAX;
    }
  } while( true );
}

Assistant:

static int
xmlAttrHashInsert(xmlParserCtxtPtr ctxt, unsigned size, const xmlChar *name,
                  const xmlChar *uri, unsigned hashValue, int aindex) {
    xmlAttrHashBucket *table = ctxt->attrHash;
    xmlAttrHashBucket *bucket;
    unsigned hindex;

    hindex = hashValue & (size - 1);
    bucket = &table[hindex];

    while (bucket->index >= 0) {
        const xmlChar **atts = &ctxt->atts[bucket->index];

        if (name == atts[0]) {
            int nsIndex = XML_PTR_TO_INT(atts[2]);

            if ((nsIndex == NS_INDEX_EMPTY) ? (uri == NULL) :
                (nsIndex == NS_INDEX_XML) ? (uri == ctxt->str_xml_ns) :
                (uri == ctxt->nsTab[nsIndex * 2 + 1]))
                return(bucket->index);
        }

        hindex++;
        bucket++;
        if (hindex >= size) {
            hindex = 0;
            bucket = table;
        }
    }

    bucket->index = aindex;

    return(INT_MAX);
}